

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O2

wchar_t uriDissectQueryMallocExMmA
                  (UriQueryListA **dest,wchar_t *itemCount,char *first,char *afterLast,
                  UriBool plusToSpace,UriBreakConversion breakConversion,UriMemoryManager *memory)

{
  char *keyAfter;
  UriBool UVar1;
  wchar_t wVar2;
  char *pcVar3;
  char *keyAfter_00;
  char *valueFirst;
  char *valueAfter;
  UriQueryListStructA **prevNext;
  wchar_t *itemCount_00;
  wchar_t nullCounter;
  
  itemCount_00 = &nullCounter;
  if (itemCount != (wchar_t *)0x0) {
    itemCount_00 = itemCount;
  }
  if (afterLast == (char *)0x0 || (first == (char *)0x0 || dest == (UriQueryListA **)0x0)) {
    wVar2 = L'\x02';
  }
  else if (afterLast < first) {
    wVar2 = L'\t';
  }
  else {
    if (memory == (UriMemoryManager *)0x0) {
      memory = &defaultMemoryManager;
    }
    else {
      UVar1 = uriMemoryManagerIsComplete(memory);
      if (UVar1 != 1) {
        return L'\n';
      }
    }
    *dest = (UriQueryListA *)0x0;
    *itemCount_00 = L'\0';
    pcVar3 = (char *)0x0;
    valueFirst = (char *)0x0;
    valueAfter = (char *)0x0;
    prevNext = dest;
    for (keyAfter_00 = first; keyAfter_00 < afterLast; keyAfter_00 = keyAfter_00 + 1) {
      if (*keyAfter_00 == '=') {
        if (pcVar3 == (char *)0x0) {
          valueFirst = keyAfter_00 + 1;
          pcVar3 = keyAfter_00;
          valueAfter = valueFirst;
        }
      }
      else if (*keyAfter_00 == '&') {
        keyAfter = keyAfter_00;
        if (valueFirst != (char *)0x0) {
          valueAfter = keyAfter_00;
          keyAfter = pcVar3;
        }
        UVar1 = uriAppendQueryItemA(prevNext,itemCount_00,first,keyAfter,valueFirst,valueAfter,
                                    plusToSpace,breakConversion,memory);
        if (UVar1 == 0) goto LAB_001a2238;
        if (prevNext == (UriQueryListStructA **)0x0) {
          prevNext = (UriQueryListStructA **)0x0;
        }
        else if (*prevNext != (UriQueryListA *)0x0) {
          prevNext = &(*prevNext)->next;
        }
        first = keyAfter_00 + 1;
        if (afterLast <= first) {
          first = (char *)0x0;
        }
        valueFirst = (char *)0x0;
        pcVar3 = (char *)0x0;
        valueAfter = (char *)0x0;
      }
    }
    if (valueFirst != (char *)0x0) {
      valueAfter = keyAfter_00;
      keyAfter_00 = pcVar3;
    }
    UVar1 = uriAppendQueryItemA(prevNext,itemCount_00,first,keyAfter_00,valueFirst,valueAfter,
                                plusToSpace,breakConversion,memory);
    wVar2 = L'\0';
    if (UVar1 == 0) {
LAB_001a2238:
      *itemCount_00 = L'\0';
      uriFreeQueryListMmA(*dest,memory);
      wVar2 = L'\x03';
    }
  }
  return wVar2;
}

Assistant:

int URI_FUNC(DissectQueryMallocExMm)(URI_TYPE(QueryList) ** dest, int * itemCount,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriBool plusToSpace, UriBreakConversion breakConversion,
		UriMemoryManager * memory) {
	const URI_CHAR * walk = first;
	const URI_CHAR * keyFirst = first;
	const URI_CHAR * keyAfter = NULL;
	const URI_CHAR * valueFirst = NULL;
	const URI_CHAR * valueAfter = NULL;
	URI_TYPE(QueryList) ** prevNext = dest;
	int nullCounter;
	int * itemsAppended = (itemCount == NULL) ? &nullCounter : itemCount;

	if ((dest == NULL) || (first == NULL) || (afterLast == NULL)) {
		return URI_ERROR_NULL;
	}

	if (first > afterLast) {
		return URI_ERROR_RANGE_INVALID;
	}

	URI_CHECK_MEMORY_MANAGER(memory);  /* may return */

	*dest = NULL;
	*itemsAppended = 0;

	/* Parse query string */
	for (; walk < afterLast; walk++) {
		switch (*walk) {
		case _UT('&'):
			if (valueFirst != NULL) {
				valueAfter = walk;
			} else {
				keyAfter = walk;
			}

			if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended,
					keyFirst, keyAfter, valueFirst, valueAfter,
					plusToSpace, breakConversion, memory)
					== URI_FALSE) {
				/* Free list we built */
				*itemsAppended = 0;
				URI_FUNC(FreeQueryListMm)(*dest, memory);
				return URI_ERROR_MALLOC;
			}

			/* Make future items children of the current */
			if ((prevNext != NULL) && (*prevNext != NULL)) {
				prevNext = &((*prevNext)->next);
			}

			if (walk + 1 < afterLast) {
				keyFirst = walk + 1;
			} else {
				keyFirst = NULL;
			}
			keyAfter = NULL;
			valueFirst = NULL;
			valueAfter = NULL;
			break;

		case _UT('='):
			/* NOTE: WE treat the first '=' as a separator, */
			/*       all following go into the value part   */
			if (keyAfter == NULL) {
				keyAfter = walk;
				if (walk + 1 <= afterLast) {
					valueFirst = walk + 1;
					valueAfter = walk + 1;
				}
			}
			break;

		default:
			break;
		}
	}

	if (valueFirst != NULL) {
		/* Must be key/value pair */
		valueAfter = walk;
	} else {
		/* Must be key only */
		keyAfter = walk;
	}

	if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended, keyFirst, keyAfter,
			valueFirst, valueAfter, plusToSpace, breakConversion, memory)
			== URI_FALSE) {
		/* Free list we built */
		*itemsAppended = 0;
		URI_FUNC(FreeQueryListMm)(*dest, memory);
		return URI_ERROR_MALLOC;
	}

	return URI_SUCCESS;
}